

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::NEG_OP(SQVM *this,SQObjectPtr *trg,SQObjectPtr *o)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  SQChar *pSVar4;
  SQWeakRef *in_RDX;
  SQCollectable *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr closure;
  undefined4 in_stack_ffffffffffffff98;
  SQFloat in_stack_ffffffffffffff9c;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  SQVM *this_00;
  undefined4 in_stack_ffffffffffffffac;
  SQMetaMethod mm;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  SQWeakRef *local_20;
  SQCollectable *local_18;
  byte local_1;
  
  iVar5 = *(int *)&(in_RDX->super_SQRefCounted)._vptr_SQRefCounted;
  if (iVar5 == 0x5000002) {
    ::SQObjectPtr::operator=
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_1 = 1;
  }
  else if (iVar5 == 0x5000004) {
    ::SQObjectPtr::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_1 = 1;
  }
  else {
    if ((((iVar5 == 0xa000020) || (iVar5 == 0xa000080)) || (iVar5 == 0xa008000)) &&
       (*(long *)((in_RDX->super_SQRefCounted)._uiRef + 0x30) != 0)) {
      this_00 = (SQVM *)&stack0xffffffffffffffd0;
      local_20 = in_RDX;
      local_18 = in_RSI;
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
      plVar1 = (long *)(local_20->super_SQRefCounted)._uiRef;
      bVar2 = (**(code **)(*plVar1 + 0x30))(plVar1,in_RDI,4,this_00);
      mm = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffac);
      if ((bVar2 & 1) == 0) {
        bVar3 = false;
      }
      else {
        Push(this_00,(SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        bVar3 = CallMetaMethod((SQVM *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                               (SQObjectPtr *)in_RDI,mm,(SQInteger)this_00,
                               (SQObjectPtr *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (bVar3) {
          _Swap((SQObject *)local_18,&(in_RDI->temp_reg).super_SQObject);
          local_1 = 1;
          bVar3 = true;
        }
        else {
          local_1 = 0;
          bVar3 = true;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
      if (bVar3) goto LAB_00143638;
    }
    pSVar4 = GetTypeName((SQObjectPtr *)0x14361d);
    Raise_Error(in_RDI,"attempt to negate a %s",pSVar4);
    local_1 = 0;
  }
LAB_00143638:
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::NEG_OP(SQObjectPtr &trg,const SQObjectPtr &o)
{

    switch(sq_type(o)) {
    case OT_INTEGER:
        trg = -_integer(o);
        return true;
    case OT_FLOAT:
        trg = -_float(o);
        return true;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_UNM, closure)) {
                Push(o);
                if(!CallMetaMethod(closure, MT_UNM, 1, temp_reg)) return false;
                _Swap(trg,temp_reg);
                return true;

            }
        }
    default:break; //shutup compiler
    }
    Raise_Error(_SC("attempt to negate a %s"), GetTypeName(o));
    return false;
}